

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

char * transform_schema2json(lys_module *module,char *expr)

{
  char cVar1;
  ly_ctx *ctx;
  char *pcVar2;
  lyxp_expr *expr_00;
  lys_module *plVar3;
  size_t sVar4;
  ushort **ppuVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *__src;
  bool bVar13;
  size_t local_50;
  
  ctx = module->ctx;
  local_50 = strlen(expr);
  local_50 = local_50 + 1;
  pcVar2 = (char *)malloc(local_50);
  if (pcVar2 == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json");
  }
  else {
    expr_00 = lyxp_parse_expr(ctx,expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      if (expr_00->used == 0) {
        lVar11 = 0;
        pcVar8 = pcVar2;
      }
      else {
        uVar9 = 0;
        lVar11 = 0;
        do {
          __src = expr_00->expr + expr_00->expr_pos[uVar9];
          if ((uVar9 != 0) &&
             (uVar6 = (int)uVar9 - 1,
             pcVar8 = expr_00->expr +
                      (ulong)expr_00->tok_len[uVar6] + (ulong)expr_00->expr_pos[uVar6],
             pcVar8 != __src)) {
            strncpy(pcVar2 + lVar11,pcVar8,(long)__src - (long)pcVar8);
            lVar11 = lVar11 + ((long)__src - (long)pcVar8);
          }
          uVar6 = (uint)expr_00->tok_len[uVar9];
          if (expr_00->tokens[uVar9] == LYXP_TOKEN_LITERAL) {
            cVar1 = *__src;
            pcVar12 = __src;
            uVar7 = uVar6;
            while (cVar1 != ':') {
              bVar13 = uVar7 == 0;
              uVar7 = uVar7 - 1;
              if ((cVar1 == '\0') || (bVar13)) goto LAB_00109b60;
              pcVar8 = pcVar12 + 1;
              pcVar12 = pcVar12 + 1;
              cVar1 = *pcVar8;
            }
            ppuVar5 = __ctype_b_loc();
            lVar10 = 0;
            while ((((*ppuVar5)[pcVar12[lVar10 + -1]] & 8) != 0 ||
                   ((uVar6 = (byte)pcVar12[lVar10 + -1] - 0x2d, uVar6 < 0x33 &&
                    ((0x4000000000003U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))) {
              lVar10 = lVar10 + -1;
            }
            plVar3 = lyp_get_module(module,pcVar12 + lVar10,(int)-lVar10,(char *)0x0,0,0);
            if (plVar3 == (lys_module *)0x0) {
              pcVar8 = expr_00->expr + expr_00->expr_pos[uVar9];
              sVar4 = (size_t)expr_00->tok_len[uVar9];
              goto LAB_00109b77;
            }
            sVar4 = strlen(plVar3->name);
            local_50 = local_50 + lVar10 + sVar4;
            pcVar8 = (char *)realloc(pcVar2,local_50);
            if (pcVar8 == (char *)0x0) {
              free(pcVar2);
              pcVar2 = (char *)0x0;
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json"
                    );
              goto LAB_00109d88;
            }
            strncpy(pcVar8 + lVar11,__src,(size_t)(pcVar12 + (lVar10 - (long)__src)));
            strcpy(pcVar8 + (long)(pcVar12 + lVar10 + (lVar11 - (long)__src)),plVar3->name);
            sVar4 = strlen(plVar3->name);
            strncpy(pcVar8 + (long)(pcVar12 + lVar10 + (lVar11 - (long)__src)) + sVar4,pcVar12,
                    (ulong)expr_00->tok_len[uVar9] -
                    (-lVar10 + (long)(pcVar12 + (lVar10 - (long)__src))));
            lVar11 = lVar11 + sVar4 + lVar10 + (ulong)expr_00->tok_len[uVar9];
          }
          else if (expr_00->tokens[uVar9] == LYXP_TOKEN_NAMETEST) {
            cVar1 = *__src;
            pcVar12 = __src;
            uVar7 = uVar6;
            while (cVar1 != ':') {
              bVar13 = uVar7 == 0;
              uVar7 = uVar7 - 1;
              if ((cVar1 == '\0') || (bVar13)) goto LAB_00109b60;
              pcVar8 = pcVar12 + 1;
              pcVar12 = pcVar12 + 1;
              cVar1 = *pcVar8;
            }
            lVar10 = (long)pcVar12 - (long)__src;
            plVar3 = lyp_get_module(module,__src,(int)lVar10,(char *)0x0,0,0);
            if (plVar3 == (lys_module *)0x0) {
              ly_vlog(ctx,LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar10,__src);
              goto LAB_00109d88;
            }
            sVar4 = strlen(plVar3->name);
            local_50 = local_50 + (sVar4 - lVar10);
            pcVar8 = (char *)realloc(pcVar2,local_50);
            if (pcVar8 == (char *)0x0) {
              free(pcVar2);
              pcVar2 = (char *)0x0;
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json"
                    );
              goto LAB_00109d88;
            }
            strcpy(pcVar8 + lVar11,plVar3->name);
            sVar4 = strlen(plVar3->name);
            strncpy(pcVar8 + sVar4 + lVar11,pcVar12,(ulong)expr_00->tok_len[uVar9] - lVar10);
            lVar11 = ((sVar4 + lVar11) - lVar10) + (ulong)expr_00->tok_len[uVar9];
          }
          else {
LAB_00109b60:
            pcVar8 = expr_00->expr + expr_00->expr_pos[uVar9];
            sVar4 = (size_t)uVar6;
LAB_00109b77:
            strncpy(pcVar2 + lVar11,pcVar8,sVar4);
            lVar11 = (ulong)expr_00->tok_len[uVar9] + lVar11;
            pcVar8 = pcVar2;
          }
          uVar9 = uVar9 + 1;
          pcVar2 = pcVar8;
        } while (uVar9 < expr_00->used);
      }
      pcVar8[lVar11] = '\0';
      lyxp_expr_free(expr_00);
      pcVar2 = lydict_insert_zc(module->ctx,pcVar8);
      return pcVar2;
    }
LAB_00109d88:
    free(pcVar2);
    lyxp_expr_free(expr_00);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    LY_CHECK_ERR_RETURN(!out, LOGMEM(ctx), NULL);
    out_used = 0;

    exp = lyxp_parse_expr(ctx, expr);
    LY_CHECK_ERR_GOTO(!exp, , error);

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lyp_get_module(module, cur_expr, pref_len, NULL, 0, 0);
            if (!mod) {
                LOGVAL(ctx, LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lyp_get_module(module, ptr, pref_len, NULL, 0, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}